

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TypeVector *types)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  TypeVector *types_00;
  string local_50;
  Type local_30;
  string_view local_28;
  CWriter *local_18;
  TypeVector *types_local;
  CWriter *this_local;
  
  local_18 = (CWriter *)types;
  types_local = (TypeVector *)this;
  bVar1 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::empty(types);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"void");
    Write(this,local_28);
  }
  else {
    sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                      ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_18);
    if (sVar2 == 1) {
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_18,0);
      local_30.enum_ = pvVar3->enum_;
      local_30.type_index_ = pvVar3->type_index_;
      Write(this,local_30);
    }
    else {
      (anonymous_namespace)::CWriter::MangleTypes_abi_cxx11_(&local_50,local_18,types_00);
      (anonymous_namespace)::CWriter::Write<char_const(&)[8],std::__cxx11::string>
                ((CWriter *)this,(char (*) [8])0x2386dd,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void CWriter::Write(const TypeVector& types) {
  if (types.empty()) {
    Write("void");
  } else if (types.size() == 1) {
    Write(types[0]);
  } else {
    Write("struct ", MangleTypes(types));
  }
}